

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  array_container_t *paVar9;
  bitset_container_t *pbVar10;
  byte bVar11;
  int32_t n_runs;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int32_t iVar16;
  uint32_t runValue;
  int iVar17;
  uint64_t *puVar18;
  
  if (((src_1->n_runs == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    if ((bitset_container_t *)*dst != src_2) {
      pbVar10 = bitset_container_clone(src_2);
      *dst = pbVar10;
      return true;
    }
    return true;
  }
  uVar6 = croaring_hardware_support();
  if ((uVar6 & 2) == 0) {
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 1) == 0) {
      iVar7 = src_1->n_runs;
      lVar13 = (long)iVar7;
      if (lVar13 < 1) goto LAB_00113694;
      lVar15 = 0;
      do {
        iVar7 = iVar7 + (uint)src_1->runs[lVar15].length;
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
    }
    else {
      iVar7 = _avx2_run_container_cardinality(src_1);
    }
  }
  else {
    iVar7 = _avx512_run_container_cardinality(src_1);
  }
  if (iVar7 < 0x1001) {
LAB_00113694:
    iVar17 = src_2->cardinality;
    if (iVar7 < src_2->cardinality) {
      iVar17 = iVar7;
    }
    paVar9 = array_container_create_given_capacity(iVar17);
    *dst = paVar9;
    if ((paVar9 != (array_container_t *)0x0) && (iVar7 = src_1->n_runs, 0 < (long)iVar7)) {
      prVar3 = src_1->runs;
      puVar4 = paVar9->array;
      puVar18 = src_2->words;
      iVar16 = paVar9->cardinality;
      lVar13 = 0;
      do {
        uVar14 = (ulong)prVar3[lVar13].value;
        iVar17 = prVar3[lVar13].length + 1;
        do {
          puVar4[iVar16] = (uint16_t)uVar14;
          iVar16 = iVar16 + (uint)((*(ulong *)((long)puVar18 + (ulong)((uint)(uVar14 >> 3) & 0x1ff8)
                                              ) >> (uVar14 & 0x3f) & 1) != 0);
          uVar14 = (ulong)((int)uVar14 + 1);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar7);
      paVar9->cardinality = iVar16;
    }
    return false;
  }
  pbVar10 = (bitset_container_t *)*dst;
  if (pbVar10 == src_2) {
    iVar7 = src_1->n_runs;
    if ((long)iVar7 < 1) {
      puVar18 = src_2->words;
      *puVar18 = 0;
      uVar12 = 0;
      uVar6 = 0;
LAB_00113a0e:
      memset((void *)((long)puVar18 + (ulong)(uVar12 >> 3 & 0x1ff8) + 8),0,
             (ulong)(uVar6 * -8 + 0x1fe8) + 8);
      uVar14 = 0xffffffffffffffff;
    }
    else {
      prVar3 = src_1->runs;
      puVar18 = src_2->words;
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar1 = prVar3[lVar13].value;
        uVar2 = prVar3[lVar13].length;
        if (uVar12 != uVar1) {
          uVar8 = uVar12 >> 6;
          uVar14 = -1L << ((byte)uVar12 & 0x3f);
          uVar6 = uVar1 - 1 >> 6;
          if (uVar6 - uVar8 == 0) {
            bVar11 = -(char)uVar1;
            uVar14 = (uVar14 << (bVar11 & 0x3f)) >> (bVar11 & 0x3f);
            uVar6 = uVar8;
          }
          else {
            puVar18[uVar8] = puVar18[uVar8] & ~uVar14;
            if (uVar8 + 1 < uVar6) {
              memset(puVar18 + (ulong)uVar8 + 1,0,(ulong)((uVar6 - uVar8) - 2) * 8 + 8);
            }
            uVar14 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
          }
          puVar18[uVar6] = puVar18[uVar6] & ~uVar14;
        }
        uVar12 = (uint)uVar1 + (uint)uVar2 + 1;
        lVar13 = lVar13 + 1;
      } while (iVar7 != lVar13);
      if (uVar12 == 0x10000) goto LAB_00113a45;
      uVar6 = uVar12 >> 6;
      uVar14 = -1L << ((byte)uVar12 & 0x3f);
      if ((uVar6 != 0x3ff) &&
         (puVar18[uVar6] = puVar18[uVar6] & ~uVar14, uVar14 = 0xffffffffffffffff, uVar12 < 0xff80))
      goto LAB_00113a0e;
    }
    puVar18[0x3ff] = puVar18[0x3ff] & ~uVar14;
LAB_00113a45:
    iVar7 = bitset_container_compute_cardinality(pbVar10);
    pbVar10->cardinality = iVar7;
    if (src_2->cardinality < 0x1001) {
      paVar9 = array_container_from_bitset(src_2);
      *dst = paVar9;
      return false;
    }
    return true;
  }
  pbVar10 = bitset_container_clone(src_2);
  *dst = pbVar10;
  if (pbVar10 == (bitset_container_t *)0x0) {
    return true;
  }
  iVar7 = src_1->n_runs;
  if ((long)iVar7 < 1) {
    puVar18 = pbVar10->words;
    *puVar18 = 0;
    uVar12 = 0;
    uVar6 = 0;
LAB_00113986:
    memset((void *)((long)puVar18 + (ulong)(uVar12 >> 3 & 0x1ff8) + 8),0,
           (ulong)(uVar6 * -8 + 0x1fe8) + 8);
    uVar14 = 0xffffffffffffffff;
  }
  else {
    prVar3 = src_1->runs;
    puVar18 = pbVar10->words;
    lVar13 = 0;
    uVar12 = 0;
    do {
      uVar1 = prVar3[lVar13].value;
      uVar2 = prVar3[lVar13].length;
      if (uVar12 != uVar1) {
        uVar8 = uVar12 >> 6;
        uVar14 = -1L << ((byte)uVar12 & 0x3f);
        uVar6 = uVar1 - 1 >> 6;
        if (uVar6 - uVar8 == 0) {
          bVar11 = -(char)uVar1;
          uVar14 = (uVar14 << (bVar11 & 0x3f)) >> (bVar11 & 0x3f);
          uVar6 = uVar8;
        }
        else {
          puVar18[uVar8] = puVar18[uVar8] & ~uVar14;
          if (uVar8 + 1 < uVar6) {
            memset(puVar18 + (ulong)uVar8 + 1,0,(ulong)((uVar6 - uVar8) - 2) * 8 + 8);
          }
          uVar14 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
        }
        puVar18[uVar6] = puVar18[uVar6] & ~uVar14;
      }
      uVar12 = (uint)uVar1 + (uint)uVar2 + 1;
      lVar13 = lVar13 + 1;
    } while (iVar7 != lVar13);
    if (uVar12 == 0x10000) goto LAB_001139bd;
    uVar6 = uVar12 >> 6;
    uVar14 = -1L << ((byte)uVar12 & 0x3f);
    if ((uVar6 != 0x3ff) &&
       (puVar18[uVar6] = puVar18[uVar6] & ~uVar14, uVar14 = 0xffffffffffffffff, uVar12 < 0xff80))
    goto LAB_00113986;
  }
  puVar18[0x3ff] = puVar18[0x3ff] & ~uVar14;
LAB_001139bd:
  iVar7 = bitset_container_compute_cardinality(pbVar10);
  pbVar10->cardinality = iVar7;
  if (iVar7 < 0x1001) {
    paVar9 = array_container_from_bitset(pbVar10);
    pvVar5 = *dst;
    if (pvVar5 != (void *)0x0) {
      (*global_memory_hook.aligned_free)(*(void **)((long)pvVar5 + 8));
      (*global_memory_hook.free)(pvVar5);
    }
    *dst = paVar9;
    return false;
  }
  return true;
}

Assistant:

bool run_bitset_container_intersection(const run_container_t *src_1,
                                       const bitset_container_t *src_2,
                                       container_t **dst) {
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}